

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolarizableAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::PolarizableAdapter::makePolarizable(PolarizableAdapter *this,RealType polarizability)

{
  AtomType *this_00;
  bool bVar1;
  PolarizableAtypeParameters polParam;
  undefined1 local_49;
  SimpleTypeData<OpenMD::PolarizableAtypeParameters> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  RealType local_30;
  shared_ptr<OpenMD::GenericData> local_28;
  PolarizableAtypeParameters local_18;
  
  local_30 = polarizability;
  bVar1 = AtomType::hasProperty(this->at_,(string *)PolTypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)PolTypeID_abi_cxx11_);
  }
  local_18.polarizability = local_30;
  this_00 = this->at_;
  local_48 = (SimpleTypeData<OpenMD::PolarizableAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>>,std::__cxx11::string_const&,OpenMD::PolarizableAtypeParameters&>
            (a_Stack_40,&local_48,
             (allocator<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> *)&local_49,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             PolTypeID_abi_cxx11_,&local_18);
  local_28.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_GenericData;
  local_28.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_40[0]._M_pi;
  local_48 = (SimpleTypeData<OpenMD::PolarizableAtypeParameters> *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_28);
  if (local_28.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  return;
}

Assistant:

void PolarizableAdapter::makePolarizable(RealType polarizability) {
    if (isPolarizable()) { at_->removeProperty(PolTypeID); }

    PolarizableAtypeParameters polParam {};
    polParam.polarizability = polarizability;

    at_->addProperty(
        std::make_shared<PolarizableAtypeData>(PolTypeID, polParam));
  }